

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void writeFile(bool perspectiveCorrection)

{
  double dVar1;
  char cVar2;
  tm *ptVar3;
  ostream *poVar4;
  double *pdVar5;
  size_type sVar6;
  int iVar7;
  queue<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::deque<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>_>
  *this;
  char *pcVar8;
  string *this_00;
  char *pcVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_7a8;
  double local_7a0;
  double local_798;
  double pos_Y;
  double pos_X;
  undefined4 local_77c;
  unique_lock<std::mutex> lock;
  double local_748;
  double local_740;
  double elapsed_X;
  int frameNumber_X;
  double local_718;
  undefined4 local_708 [2];
  undefined1 *local_700;
  undefined8 local_6f8;
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  string file_name;
  string file_name_Y;
  string min;
  string hour;
  string month;
  string day;
  time_t theTime;
  Mat extracted_Mat_X;
  ostringstream oss;
  ofstream txt_file;
  uint auStack_418 [122];
  ofstream txt_file_Y;
  uint auStack_218 [122];
  
  theTime = time((time_t *)0x0);
  ptVar3 = localtime(&theTime);
  std::__cxx11::to_string(&day,ptVar3->tm_mday);
  std::__cxx11::to_string(&month,ptVar3->tm_mon + 1);
  iVar7 = ptVar3->tm_year + 0x76c;
  std::__cxx11::to_string(&hour,ptVar3->tm_hour);
  std::__cxx11::to_string(&min,ptVar3->tm_min);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  if (month._M_string_length == 1) {
    poVar4 = std::operator<<((ostream *)&oss,"../PendulumCsv/");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
    pcVar8 = "_0";
  }
  else {
    poVar4 = std::operator<<((ostream *)&oss,"../PendulumCsv/");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
    pcVar8 = "_";
  }
  poVar4 = std::operator<<(poVar4,pcVar8);
  std::operator<<(poVar4,(string *)&month);
  pcVar9 = "_";
  pcVar8 = "_";
  if (day._M_string_length == 1) {
    pcVar8 = "_0";
  }
  poVar4 = std::operator<<((ostream *)&oss,pcVar8);
  std::operator<<(poVar4,(string *)&day);
  pcVar8 = "_";
  if (hour._M_string_length == 1) {
    pcVar8 = "_0";
  }
  poVar4 = std::operator<<((ostream *)&oss,pcVar8);
  std::operator<<(poVar4,(string *)&hour);
  if (min._M_string_length == 1) {
    pcVar9 = "_0";
  }
  poVar4 = std::operator<<((ostream *)&oss,pcVar9);
  std::operator<<(poVar4,(string *)&min);
  file_name_Y._M_dataplus._M_p = (pointer)&file_name_Y.field_2;
  file_name_Y._M_string_length = 0;
  file_name._M_dataplus._M_p = (pointer)&file_name.field_2;
  file_name._M_string_length = 0;
  file_name_Y.field_2._M_local_buf[0] = '\0';
  file_name.field_2._M_local_buf[0] = '\0';
  if (perspectiveCorrection) {
    std::operator<<((ostream *)&oss,"_Y.csv");
    std::__cxx11::stringbuf::str();
    this_00 = &file_name_Y;
  }
  else {
    std::operator<<((ostream *)&oss,"_N.csv");
    std::__cxx11::stringbuf::str();
    this_00 = &file_name;
  }
  std::__cxx11::string::operator=((string *)this_00,(string *)&txt_file);
  std::__cxx11::string::~string((string *)&txt_file);
  std::ofstream::ofstream(&txt_file,(string *)&file_name,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Opened file ");
    poVar4 = std::operator<<(poVar4,(string *)&file_name);
    std::operator<<(poVar4,"\n");
  }
  std::ofstream::ofstream(&txt_file_Y,(string *)&file_name_Y,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Opened file ");
    poVar4 = std::operator<<(poVar4,(string *)&file_name_Y);
    std::operator<<(poVar4,"\n");
  }
  std::operator<<((ostream *)&txt_file,"time;x;y\n");
  std::operator<<((ostream *)&txt_file_Y,"time;x;y\n");
  cv::Mat::Mat(&extracted_Mat_X);
  cv::namedWindow((string *)&image_window_abi_cxx11_,0);
  std::__cxx11::string::string((string *)&lock,"Show graph",(allocator *)local_708);
  cv::createButton((string *)&lock,toggleView,(void *)0x0,1,false);
  std::__cxx11::string::~string((string *)&lock);
  std::__cxx11::string::string((string *)&lock,"Number of graph points",(allocator *)local_708);
  iVar7 = 0;
  cv::createTrackbar((string *)&lock,(string *)&image_window_abi_cxx11_,ptrGraphPoints,1000,
                     checkTrackbar,(void *)0x0);
  std::__cxx11::string::~string((string *)&lock);
  local_7a8 = 0.0;
  pdVar5 = (double *)0x0;
  local_77c = 0;
  do {
    local_718 = local_798;
    while( true ) {
      if ((expectedFrameNumber & 1U) == 0) {
        std::unique_lock<std::mutex>::unique_lock(&lock,&requestA.mx);
        while (resultQueue_A.c.
               super__Deque_base<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
               resultQueue_A.c.
               super__Deque_base<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::condition_variable::wait((unique_lock *)&requestA.cv);
        }
        std::unique_lock<std::mutex>::~unique_lock(&lock);
        this = &resultQueue_A;
      }
      else {
        std::unique_lock<std::mutex>::unique_lock(&lock,&requestB.mx);
        while (resultQueue_B.c.
               super__Deque_base<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
               resultQueue_B.c.
               super__Deque_base<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::condition_variable::wait((unique_lock *)&requestB.cv);
        }
        std::unique_lock<std::mutex>::~unique_lock(&lock);
        this = &resultQueue_B;
      }
      lock._M_device = (mutex_type *)&pos_Y;
      lock._8_8_ = &pos_X;
      std::_Tuple_impl<0ul,cv::Mat&,int&,double&,double&,double&>::
      _M_assign<cv::Mat,int,double,double,double>
                ((_Tuple_impl<0ul,cv::Mat&,int&,double&,double&,double&> *)&lock,
                 &((this->c).
                   super__Deque_base<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_cv::Mat,_int,_double,_double,_double>);
      std::
      deque<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>
      ::pop_front(&this->c);
      if (perspectiveCorrection) {
        dVar12 = myMatrix[0][0] * pos_X + myMatrix[0][1] * pos_Y + myMatrix[0][2];
        dVar13 = myMatrix[2][0] * pos_X + myMatrix[2][1] * pos_Y + myMatrix[2][2];
        dVar10 = pos_X * myMatrix[1][0] + pos_Y * myMatrix[1][1] + myMatrix[1][2];
        *(uint *)((long)auStack_218 + *(long *)(_txt_file_Y + -0x18)) =
             *(uint *)((long)auStack_218 + *(long *)(_txt_file_Y + -0x18)) & 0xfffffefb | 4;
        poVar4 = std::ostream::_M_insert<double>(-1.0);
        poVar4 = std::operator<<(poVar4,";");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(dVar12 / dVar13));
        poVar4 = std::operator<<(poVar4,";");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(dVar10 / dVar13));
        std::operator<<(poVar4,"\n");
        std::ostream::flush();
      }
      *(uint *)((long)auStack_418 + *(long *)(_txt_file + -0x18)) =
           *(uint *)((long)auStack_418 + *(long *)(_txt_file + -0x18)) & 0xfffffefb | 4;
      poVar4 = std::ostream::_M_insert<double>(-1.0);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)pos_X);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)pos_Y);
      std::operator<<(poVar4,"\n");
      std::ostream::flush();
      expectedFrameNumber = expectedFrameNumber + 1;
      dVar10 = pos_X + -319.7900085449219;
      dVar13 = pos_Y + -245.0;
      dVar12 = SQRT(dVar13 * dVar13 + dVar10 * dVar10);
      if (local_77c == 0) {
        local_798 = local_718;
        goto LAB_00106270;
      }
      local_798 = local_7a0;
      if ((((local_77c == 1) || (local_7a0 <= 100.0)) || (local_7a0 <= local_718)) ||
         (local_7a0 < dVar12)) goto LAB_00106270;
      if (pdVar5 != (double *)0x0) break;
      pdVar5 = (double *)operator_new__(0x18);
      *pdVar5 = local_740;
      pdVar5[1] = local_748;
      local_718 = local_7a0;
      pdVar5[2] = local_7a0;
      local_7a0 = dVar12;
      local_748 = dVar13;
      local_740 = dVar10;
    }
    dVar11 = local_740 - *pdVar5;
    dVar1 = 90.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar11 = atan((local_748 - pdVar5[1]) / dVar11);
      dVar1 = (dVar11 * 180.0) / 3.14159265;
    }
    dVar11 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                     (ulong)(dVar1 + 180.0) & -(ulong)(dVar1 < 0.0));
    if (iVar7 == 10) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Elapsed time: ");
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
      poVar4 = std::ostream::_M_insert<double>(-1.0);
      std::operator<<(poVar4,", angle: ");
      poVar4 = std::ostream::_M_insert<double>(local_7a8 / 10.0);
      std::endl<char,std::char_traits<char>>(poVar4);
      pdVar5 = (double *)0x0;
      iVar7 = 1;
      local_7a8 = dVar11;
    }
    else {
      local_7a8 = local_7a8 + dVar11;
      iVar7 = iVar7 + 1;
      pdVar5 = (double *)0x0;
    }
LAB_00106270:
    lock._M_device = (mutex_type *)pos_X;
    lock._8_8_ = pos_Y;
    std::deque<cv::Point_<double>,std::allocator<cv::Point_<double>>>::
    emplace_back<cv::Point_<double>>
              ((deque<cv::Point_<double>,std::allocator<cv::Point_<double>>> *)&pointsVector,
               (Point_<double> *)&lock);
    local_6f8 = 0;
    local_708[0] = 0x3010000;
    local_6e0 = (int)ROUND(pos_X);
    local_700 = plot_image;
    local_6dc = (int)ROUND(pos_Y);
    local_6d8 = local_6e0;
    local_6d4 = local_6dc;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&lock);
    lock._M_device = (mutex_type *)0x0;
    lock._M_owns = false;
    lock._9_7_ = 0;
    cv::line(local_708,&local_6d8,&local_6e0,(_InputArray *)&lock,1,8,0);
    sVar6 = std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>::size
                      (&pointsVector.c);
    if ((ulong)(long)graphPoints <= sVar6) {
      while (sVar6 = std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>::size
                               (&pointsVector.c), (ulong)(long)graphPoints < sVar6) {
        local_6f0 = (int)ROUND((pointsVector.c.
                                super__Deque_base<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->x);
        local_6ec = (int)ROUND((pointsVector.c.
                                super__Deque_base<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur)->y);
        local_6f8 = 0;
        local_708[0] = 0x3010000;
        local_700 = plot_image;
        local_6e8 = local_6f0;
        local_6e4 = local_6ec;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&lock);
        lock._M_device = (mutex_type *)0x406fe00000000000;
        lock._M_owns = false;
        lock._9_7_ = 0x406fe000000000;
        cv::line(local_708,&local_6e8,&local_6f0,(_InputArray *)&lock,1,8,0);
        std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>::pop_front
                  (&pointsVector.c);
      }
    }
    if (is_graph_activated == true) {
      lock._M_device = (mutex_type *)CONCAT44(lock._M_device._4_4_,0x1010000);
      lock._8_8_ = plot_image;
      cv::imshow((string *)&image_window_abi_cxx11_,(_InputArray *)&lock);
    }
    else {
      lock._M_device = (mutex_type *)CONCAT44(lock._M_device._4_4_,0x1010000);
      lock._8_8_ = &extracted_Mat_X;
      cv::imshow((string *)&image_window_abi_cxx11_,(_InputArray *)&lock);
    }
    local_77c = local_77c + 1;
    cv::waitKey(1);
    local_7a0 = dVar12;
    local_748 = dVar13;
    local_740 = dVar10;
  } while( true );
}

Assistant:

[[noreturn]] void writeFile(const bool perspectiveCorrection){

    time_t theTime = time(NULL);
    struct tm *aTime = localtime(&theTime);

    /// Getting the current time
    string day = std::to_string(aTime->tm_mday);
    string month = std::to_string(aTime->tm_mon + 1); // Month is 0 - 11, add 1 to get a jan-dec 1-12
    int year = aTime->tm_year + 1900; // Year is # years since 1900
    string hour = std::to_string(aTime->tm_hour);
    string min = std::to_string(aTime->tm_min);

    /// Setting the right name for the file that will store the centers positions
    /// Y means "yes perspective correction"
    std::ostringstream oss;
    // adding 0 in front if necessary to always have a name of the form XXXX_XX_XX_XX_XX_N.csv
    if (month.length()==1){
        // add a front 0 to the month
        oss << "../PendulumCsv/" <<year<<"_0"<<month;
    }else{
        oss << "../PendulumCsv/" <<year<<"_"<<month;
    }
    if(day.length()==1){
        oss<<"_0"<<day;
    }else{
        oss<<"_"<<day;
    }
    if(hour.length()==1){
        oss<<"_0"<<hour;
    }else{
        oss<<"_"<<hour;
    }
    if(min.length()==1){
        oss<<"_0"<<min;
    }else{
        oss<<"_"<<min;
    }
    std::string file_name_Y;
    std::string file_name;
    if(perspectiveCorrection){
        oss<<"_Y.csv";
        file_name_Y = oss.str();
    }else{
        oss<<"_N.csv";
        file_name = oss.str();
    }

    /// Opening the file where will be saved the coordinates of centers on each frame
    ofstream txt_file (file_name);
    if (txt_file.is_open())
        cout << "Opened file "<< file_name<<"\n";

    ofstream txt_file_Y (file_name_Y);
    if (txt_file_Y.is_open())
        cout << "Opened file "<< file_name_Y<<"\n";

    txt_file <<"time;x;y\n";
    txt_file_Y <<"time;x;y\n";

    int frameNumber_X=-1;
    double elapsed_X=-1.0;
    double pos_X;
    double pos_Y;
    std::queue<tuple<Mat, int, double, double, double>> *resultQueue_X;
    Mat extracted_Mat_X;
    Point2d lastPoint;

    namedWindow(image_window,WINDOW_GUI_EXPANDED);
    createButton("Show graph", toggleView, NULL, QT_CHECKBOX, 0);
    createTrackbar("Number of graph points",image_window, ptrGraphPoints,1000,checkTrackbar,NULL);


    // variables for the perspective
    double new_position_x;
    double new_position_y;
    double num;
    double dem;

    // variables for computing angle
    float xCenter= 319.79;
    float yCenter= 245.00;
    // npts is the total number of points
    int npts=0;
    // number of maximum
    int Nmassi = 0;

    // last, current and next elements to evaluate. Each array has the form [x, y, radius].
    double last[3];
    double current[3];
    double next[3];
    double* lastMax = nullptr;

    double sumTheta=0;
    int innerCountMax = 0;
    // mean over maxNum of pair of maximum for theta
    int maxNum=10;
    //std::cout<<"Mean of theta over "<<maxNum*2<<" maximum"<<std::endl;

    float Rgood = 100;

    while(true){

        // checking if the expected frame number is even or odd (if even we extract from the resultQueue_A, if
        // odd from the resultQueue_B)
        if (expectedFrameNumber % 2 ==0){
            //waiting until some elements is added to the queue of results
            std::unique_lock<std::mutex> lock(requestA.mx);
            requestA.cv.wait(lock, []{return !resultQueue_A.empty();});
            resultQueue_X = &resultQueue_A;
        }else{
            //waiting until some elements is added to the queue of results
            std::unique_lock<std::mutex> lock(requestB.mx);
            requestB.cv.wait(lock, []{return !resultQueue_B.empty();});
            resultQueue_X = &resultQueue_B;
        }

        //a frame has been added to the queue we were waiting for, now we can extract the desired frame and related variables
        tie(extracted_Mat_X, frameNumber_X, elapsed_X, pos_X, pos_Y) = resultQueue_X->front();

        resultQueue_X->pop();

        /// Perspective adjustments, only if required by the user
        if(perspectiveCorrection) {
            num = myMatrix[0][0] * pos_X + myMatrix[0][1] * pos_Y + myMatrix[0][2];
            dem = myMatrix[2][0] * pos_X + myMatrix[2][1] * pos_Y + myMatrix[2][2];

            new_position_x = num / dem;
            num = myMatrix[1][0] * pos_X + myMatrix[1][1] * pos_Y + myMatrix[1][2];
            dem = myMatrix[2][0] * pos_X + myMatrix[2][1] * pos_Y + myMatrix[2][2];
            new_position_y = num / dem;
            txt_file_Y << fixed << elapsed_X << ";" << (int)(new_position_x) << ";" << (int)(new_position_y) << "\n";
            txt_file_Y.flush();
        }
        /// saving to txt the positions found in MatchingMethod

        txt_file << fixed << elapsed_X << ";" << (int)(pos_X) << ";" << (int)(pos_Y) << "\n";
        txt_file.flush();
        // incrementing the expectedFrameNumber because we handled the frame and we can pass to the later one
        expectedFrameNumber++;


        /// computing the angle
        // - time is the current time
        // - xx is the x coordinate obtained from (x coord - xCenter)
        // - yy is the y coordinate obtained from (y coord - yCenter)
        // - rr is the radius obtained from sqrt(xx^2+yy^2)
        double xx = pos_X-xCenter;
        double yy = pos_Y-yCenter;
        double rr = sqrt(pow(xx, 2) + pow(yy, 2));

        if(npts == 0){
            next[0]=xx;
            next[1]=yy;
            next[2]=rr;
        }else if(npts==1){
            current[0]=next[0];
            current[1]=next[1];
            current[2]=next[2];
            next[0]=xx;
            next[1]=yy;
            next[2]=rr;
        }else{
            last[0]=current[0];
            last[1]=current[1];
            last[2]=current[2];
            current[0]=next[0];
            current[1]=next[1];
            current[2]=next[2];
            next[0]=xx;
            next[1]=yy;
            next[2]=rr;

            if ((current[2] > last[2]) && (current[2] >= next[2]) && (current[2] > Rgood)){
                // found a new maximum
                Nmassi++;
                // we evaluate the maximums two by two
                if(lastMax == nullptr){ //checks the size of the array. If the size is zero
                    lastMax = new double[3];
                    // this is the first of the couple to evaluate
                    lastMax[0]=current[0];
                    lastMax[1]=current[1];
                    lastMax[2]=current[2];
                    continue;
                }

                // use the consecutive maximum coordinates to obtain theta:
                // arctan((y_current - y_last)/(x_current - x_last))
                double theta;

                if ((current[0] - lastMax[0])==0){
                    // making sure that the denominator is not 0, and if so the arctan is 90 degrees
                    theta=90;
                }else{
                    theta = atan((current[1] - lastMax[1])/(current[0] - lastMax[0])) *180 / PI; // arctan in degrees
                }
                if (theta < 0){
                    theta = theta + 180;
                }

                // theta is shown averaged over maxNum consecutive maxima
                if(innerCountMax==maxNum){
                    sumTheta=sumTheta/maxNum;
                    std::cout << "Elapsed time: "<< fixed << elapsed_X <<", angle: " << sumTheta << std::endl;
                    sumTheta=theta;
                    innerCountMax=1;
                }else{
                    sumTheta+=theta;
                    innerCountMax++;
                }

                // we evaluated two max
                lastMax = nullptr;
            }
        }
        npts++;

        /// we add the OLD point to the pointsVector to be shown on plot_image Mat
        pointsVector.push(Point2d(pos_X,pos_Y));
        /// we start displaying the points
        cv::line(plot_image, Point2d(pos_X,pos_Y), Point2d(pos_X,pos_Y), cv::Scalar(0,0,0), 1);

        /// we want to display in the graph no more than 30 points. The 30th point is discarded by coloring it white
        if (pointsVector.size()>=graphPoints){
            while(pointsVector.size()>graphPoints){
                lastPoint = pointsVector.front();
                cv::line(plot_image, lastPoint, lastPoint, cv::Scalar(255,255,255), 1);
                pointsVector.pop();
            }
        }
        if(is_graph_activated)
            imshow(image_window, plot_image);
        else
            imshow(image_window, extracted_Mat_X);

        waitKey(1);
    }
}